

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall ocl::OpenCLEngine::OpenCLEngine(OpenCLEngine *this)

{
  _Rb_tree_header *p_Var1;
  
  DeviceInfo::DeviceInfo(&this->device_info_);
  p_Var1 = &(this->programs_)._M_t._M_impl.super__Rb_tree_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->programs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->kernels_)._M_t._M_impl.super__Rb_tree_header;
  (this->kernels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->kernels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->kernels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->kernels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->kernels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->total_mem_size_ = 0;
  this->platform_id_ = (cl_platform_id)0x0;
  this->device_id_ = (cl_device_id)0x0;
  this->context_ = (cl_context)0x0;
  this->command_queue_ = (cl_command_queue)0x0;
  return;
}

Assistant:

OpenCLEngine::OpenCLEngine()
{
	platform_id_				= 0;
	device_id_					= 0;
	context_					= 0;
	command_queue_				= 0;
	total_mem_size_				= 0;
}